

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall json11::Statics::Statics(Statics *this)

{
  shared_ptr<json11::JsonBoolean> local_58 [2];
  undefined1 local_31;
  shared_ptr<json11::JsonBoolean> local_30;
  shared_ptr<json11::JsonNull> local_20;
  Statics *local_10;
  Statics *this_local;
  
  local_10 = this;
  std::make_shared<json11::JsonNull>();
  std::shared_ptr<json11::JsonValue>::shared_ptr<json11::JsonNull,void>(&this->null,&local_20);
  std::shared_ptr<json11::JsonNull>::~shared_ptr(&local_20);
  local_31 = 1;
  std::make_shared<json11::JsonBoolean,bool>((bool *)&local_30);
  std::shared_ptr<json11::JsonValue>::shared_ptr<json11::JsonBoolean,void>(&this->t,&local_30);
  std::shared_ptr<json11::JsonBoolean>::~shared_ptr(&local_30);
  std::make_shared<json11::JsonBoolean,bool>((bool *)local_58);
  std::shared_ptr<json11::JsonValue>::shared_ptr<json11::JsonBoolean,void>(&this->f,local_58);
  std::shared_ptr<json11::JsonBoolean>::~shared_ptr(local_58);
  std::__cxx11::string::string((string *)&this->empty_string);
  std::vector<json11::Json,_std::allocator<json11::Json>_>::vector(&this->empty_vector);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>
  ::map(&this->empty_map);
  return;
}

Assistant:

Statics() {}